

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void shld_EvGvIb(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  byte *pbVar3;
  byte *pbVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  UInt8 UVar11;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10004;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"shld",5);
    (pMyDisasm->Reserved_).ImmediatSize = 8;
    EvGv(pMyDisasm);
    pbVar3 = (byte *)(pMyDisasm->Reserved_).EIP_;
    pbVar4 = (byte *)(pMyDisasm->Reserved_).EndOfBlock;
    (pMyDisasm->Reserved_).EIP_ = (UIntPtr)(pbVar3 + 1);
    if (pbVar4 < pbVar3 + 1 && pbVar4 != (byte *)0x0) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
    else {
      (pMyDisasm->Instruction).Immediat = (ulong)*pbVar3;
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.8X",(ulong)*pbVar3);
      (pMyDisasm->Operand3).OpType = 0x8040000;
      (pMyDisasm->Operand3).OpSize = 8;
      pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
      *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
      pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
      UVar5 = EFLAGS_TABLE[0x61].SF_;
      UVar6 = EFLAGS_TABLE[0x61].ZF_;
      UVar7 = EFLAGS_TABLE[0x61].AF_;
      UVar8 = EFLAGS_TABLE[0x61].PF_;
      UVar9 = EFLAGS_TABLE[0x61].CF_;
      UVar10 = EFLAGS_TABLE[0x61].TF_;
      UVar11 = EFLAGS_TABLE[0x61].IF_;
      (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x61].OF_;
      (pMyDisasm->Instruction).Flags.SF_ = UVar5;
      (pMyDisasm->Instruction).Flags.ZF_ = UVar6;
      (pMyDisasm->Instruction).Flags.AF_ = UVar7;
      (pMyDisasm->Instruction).Flags.PF_ = UVar8;
      (pMyDisasm->Instruction).Flags.CF_ = UVar9;
      (pMyDisasm->Instruction).Flags.TF_ = UVar10;
      (pMyDisasm->Instruction).Flags.IF_ = UVar11;
      UVar5 = EFLAGS_TABLE[0x61].NT_;
      UVar6 = EFLAGS_TABLE[0x61].RF_;
      UVar7 = EFLAGS_TABLE[0x61].alignment;
      (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x61].DF_;
      (pMyDisasm->Instruction).Flags.NT_ = UVar5;
      (pMyDisasm->Instruction).Flags.RF_ = UVar6;
      (pMyDisasm->Instruction).Flags.alignment = UVar7;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ shld_EvGvIb(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+SHIFT_ROTATE;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "shld");
  #endif
  GV.ImmediatSize = 8;
  EvGv(pMyDisasm);
  GV.EIP_+= 1;
  if (!Security(0, pMyDisasm)) return;

  pMyDisasm->Instruction.Immediat = *((UInt8*) (GV.EIP_- 1));
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.8X",(Int64) *((UInt8*) (GV.EIP_- 1)));
  #endif
  pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
  pMyDisasm->Operand3.OpSize = 8;

  FillFlags(pMyDisasm, 97);
}